

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

void __thiscall soplex::DSVectorBase<double>::add(DSVectorBase<double> *this,int i,double *v)

{
  makeMem(this,1);
  SVectorBase<double>::add(&this->super_SVectorBase<double>,i,v);
  return;
}

Assistant:

void add(int i, const R& v)
   {
      makeMem(1);
      SVectorBase<R>::add(i, v);
   }